

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzArEx_Extract(CSzArEx *p,ILookInStream *inStream,UInt32 fileIndex,UInt32 *blockIndex,
                   Byte **tempBuf,size_t *outBufferSize,size_t *offset,size_t *outSizeProcessed,
                   ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  uint folderIndex_00;
  UInt32 UVar1;
  UInt64 UVar2;
  long lVar3;
  uint *in_RCX;
  uint in_EDX;
  CSzAr *in_RDI;
  long *in_R8;
  ulong *in_R9;
  long *in_stack_00000008;
  UInt64 unpackPos;
  size_t unpackSize;
  UInt64 unpackSizeSpec;
  SRes res;
  UInt32 folderIndex;
  ILookInStream *in_stack_00000090;
  UInt32 in_stack_0000009c;
  CSzAr *in_stack_000000a0;
  ISzAlloc *in_stack_000000c0;
  UInt64 in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  int local_40;
  SRes local_4;
  
  folderIndex_00 = *(uint *)((long)in_RDI[2].FoCodersOffsets + (ulong)in_EDX * 4);
  local_40 = 0;
  *in_stack_00000008 = 0;
  *(undefined8 *)unpackPos = 0;
  if (folderIndex_00 == 0xffffffff) {
    (**(code **)(unpackSize + 8))(unpackSize,*in_R8);
    *in_RCX = 0xffffffff;
    *in_R8 = 0;
    *in_R9 = 0;
    local_4 = 0;
  }
  else {
    if ((*in_R8 == 0) || (*in_RCX != folderIndex_00)) {
      UVar2 = SzAr_GetFolderUnpackSize(in_RDI,folderIndex_00);
      *in_RCX = folderIndex_00;
      (**(code **)(unpackSize + 8))(unpackSize,*in_R8);
      *in_R8 = 0;
      *in_R9 = UVar2;
      if (UVar2 != 0) {
        lVar3 = (**(code **)unpackSize)(unpackSize,UVar2);
        *in_R8 = lVar3;
        if (*in_R8 == 0) {
          local_40 = 2;
        }
      }
      if (local_40 == 0) {
        local_40 = SzAr_DecodeFolder(in_stack_000000a0,in_stack_0000009c,in_stack_00000090,
                                     (UInt64)allocTemp,(Byte *)allocMain,(size_t)outSizeProcessed,
                                     in_stack_000000c0);
        in_stack_ffffffffffffff98 = unpackSizeSpec;
      }
    }
    if (local_40 == 0) {
      lVar3 = *(long *)(in_RDI[1].FolderCRCs.Vals + (ulong)in_EDX * 2);
      *in_stack_00000008 =
           lVar3 - *(long *)(in_RDI[1].FolderCRCs.Vals +
                            (ulong)in_RDI[2].FolderCRCs.Vals[folderIndex_00] * 2);
      *(long *)unpackPos = *(long *)(in_RDI[1].FolderCRCs.Vals + (ulong)(in_EDX + 1) * 2) - lVar3;
      if (*in_R9 < (ulong)(*in_stack_00000008 + *(long *)unpackPos)) {
        return 0xb;
      }
      if (((in_RDI[1].FoStartPackStreamIndex != (UInt32 *)0x0) &&
          (((uint)*(byte *)((long)in_RDI[1].FoStartPackStreamIndex + (ulong)(in_EDX >> 3)) &
           0x80 >> ((byte)in_EDX & 7)) != 0)) &&
         (UVar1 = CrcCalc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
         UVar1 != in_RDI[1].FoToCoderUnpackSizes[in_EDX])) {
        local_40 = 3;
      }
    }
    local_4 = local_40;
  }
  return local_4;
}

Assistant:

SRes SzArEx_Extract(
    const CSzArEx *p,
    ILookInStream *inStream,
    UInt32 fileIndex,
    UInt32 *blockIndex,
    Byte **tempBuf,
    size_t *outBufferSize,
    size_t *offset,
    size_t *outSizeProcessed,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp)
{
  UInt32 folderIndex = p->FileToFolder[fileIndex];
  SRes res = SZ_OK;
  
  *offset = 0;
  *outSizeProcessed = 0;
  
  if (folderIndex == (UInt32)-1)
  {
    IAlloc_Free(allocMain, *tempBuf);
    *blockIndex = folderIndex;
    *tempBuf = NULL;
    *outBufferSize = 0;
    return SZ_OK;
  }

  if (*tempBuf == NULL || *blockIndex != folderIndex)
  {
    UInt64 unpackSizeSpec = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
    /*
    UInt64 unpackSizeSpec =
        p->UnpackPositions[p->FolderToFile[folderIndex + 1]] -
        p->UnpackPositions[p->FolderToFile[folderIndex]];
    */
    size_t unpackSize = (size_t)unpackSizeSpec;

    if (unpackSize != unpackSizeSpec)
      return SZ_ERROR_MEM;
    *blockIndex = folderIndex;
    IAlloc_Free(allocMain, *tempBuf);
    *tempBuf = NULL;
    
    if (res == SZ_OK)
    {
      *outBufferSize = unpackSize;
      if (unpackSize != 0)
      {
        *tempBuf = (Byte *)IAlloc_Alloc(allocMain, unpackSize);
        if (*tempBuf == NULL)
          res = SZ_ERROR_MEM;
      }
  
      if (res == SZ_OK)
      {
        res = SzAr_DecodeFolder(&p->db, folderIndex,
            inStream, p->dataPos, *tempBuf, unpackSize, allocTemp);
      }
    }
  }

  if (res == SZ_OK)
  {
    UInt64 unpackPos = p->UnpackPositions[fileIndex];
    *offset = (size_t)(unpackPos - p->UnpackPositions[p->FolderToFile[folderIndex]]);
    *outSizeProcessed = (size_t)(p->UnpackPositions[fileIndex + 1] - unpackPos);
    if (*offset + *outSizeProcessed > *outBufferSize)
      return SZ_ERROR_FAIL;
    if (SzBitWithVals_Check(&p->CRCs, fileIndex))
      if (CrcCalc(*tempBuf + *offset, *outSizeProcessed) != p->CRCs.Vals[fileIndex])
        res = SZ_ERROR_CRC;
  }

  return res;
}